

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O3

char __thiscall ST::format_writer::fetch_prefix(format_writer *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = this->m_format_str;
  pcVar4 = pcVar3;
  do {
    cVar2 = *pcVar4;
    if (cVar2 == '{') {
      if (pcVar4[1] != '{') {
LAB_001a3e0d:
        if (pcVar4 != pcVar3) {
          (*this->_vptr_format_writer[2])(this);
        }
        this->m_format_str = pcVar4;
        return *pcVar4;
      }
LAB_001a3deb:
      pcVar1 = pcVar4 + 1;
      (*this->_vptr_format_writer[2])(this,pcVar3,(long)pcVar4 - (long)pcVar3);
      this->m_format_str = pcVar1;
      pcVar3 = pcVar1;
      pcVar4 = pcVar1;
    }
    else if (cVar2 == '}') {
      if (pcVar4[1] == '}') goto LAB_001a3deb;
    }
    else if (cVar2 == '\0') goto LAB_001a3e0d;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

ST_NODISCARD
        char fetch_prefix()
        {
            const char *next = m_format_str;
            while (*next) {
                if (*next == '{') {
                    if (*(next + 1) != '{')
                        break;

                    append(m_format_str, next - m_format_str);
                    m_format_str = ++next;
                } else if (*next == '}') {
                    if (*(next + 1) == '}') {
                        append(m_format_str, next - m_format_str);
                        m_format_str = ++next;
                    }
                }
                ++next;
            }
            if (next != m_format_str)
                append(m_format_str, next - m_format_str);
            m_format_str = next;

            return *m_format_str;
        }